

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

_Bool get_character_name(char *buf,size_t buflen)

{
  _Bool _Var1;
  _Bool res;
  size_t buflen_local;
  char *buf_local;
  
  event_signal(EVENT_MESSAGE_FLUSH);
  prt("Enter a name for your character (* for a random name): ",L'\0',L'\0');
  my_strcpy(buf,player->full_name,buflen);
  _Var1 = askfor_aux_ext(buf,buflen,get_name_keypress,handle_name_mouse);
  prt("",L'\0',L'\0');
  if (!_Var1) {
    my_strcpy(buf,player->full_name,buflen);
  }
  return _Var1;
}

Assistant:

bool get_character_name(char *buf, size_t buflen)
{
	bool res;

	/* Paranoia */
	event_signal(EVENT_MESSAGE_FLUSH);

	/* Display prompt */
	prt("Enter a name for your character (* for a random name): ", 0, 0);

	/* Save the player name */
	my_strcpy(buf, player->full_name, buflen);

	/* Ask the user for a string */
	res = askfor_aux_ext(buf, buflen, get_name_keypress, handle_name_mouse);

	/* Clear prompt */
	prt("", 0, 0);

	/* Revert to the old name if the player doesn't pick a new one. */
	if (!res)
		my_strcpy(buf, player->full_name, buflen);

	return res;
}